

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

void anon_unknown.dwarf_d603ce::clipLine<((anonymous_namespace)::Edge)0>
               (QPointF *a,QPointF *b,qreal t,QPainterPath *result)

{
  bool bVar1;
  bool bVar2;
  QLineF *in_RDX;
  QPointF *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QPointF *in_XMM0_Qa;
  bool outB;
  bool outA;
  qreal in_stack_ffffffffffffff28;
  QPointF *in_stack_ffffffffffffff30;
  QLineF *in_stack_ffffffffffffff40;
  QPainterPath *in_stack_ffffffffffffff48;
  QLineF local_88;
  QPointF local_68;
  QLineF local_58;
  QPointF local_38;
  QLineF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = compare<((anonymous_namespace)::Edge)0>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  bVar2 = compare<((anonymous_namespace)::Edge)0>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if ((!bVar1) || (!bVar2)) {
    if (bVar1) {
      local_38 = intersectLine<((anonymous_namespace)::Edge)0>(in_RSI,in_XMM0_Qa,(qreal)in_RDX);
      QLineF::QLineF(&local_28,&local_38,in_RSI);
      addLine((QPainterPath *)in_RDX,in_stack_ffffffffffffff40);
    }
    else if (bVar2) {
      local_68 = intersectLine<((anonymous_namespace)::Edge)0>(in_RSI,in_XMM0_Qa,(qreal)in_RDX);
      QLineF::QLineF(&local_58,in_RDI,&local_68);
      addLine(in_stack_ffffffffffffff48,in_RDX);
    }
    else {
      QLineF::QLineF(&local_88,in_RDI,in_RSI);
      addLine(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clipLine(const QPointF &a, const QPointF &b, qreal t, QPainterPath &result)
{
    bool outA = compare<edge>(a, t);
    bool outB = compare<edge>(b, t);
    if (outA && outB)
        return;

    if (outA)
        addLine(result, QLineF(intersectLine<edge>(a, b, t), b));
    else if (outB)
        addLine(result, QLineF(a, intersectLine<edge>(a, b, t)));
    else
        addLine(result, QLineF(a, b));
}